

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::json::Value::Field::Reader>::setCapacity
          (Vector<capnp::json::Value::Field::Reader> *this,size_t newSize)

{
  Reader *pRVar1;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar2;
  Reader *pRVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<capnp::json::Value::Field::Reader> local_48;
  
  pRVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pRVar1 >> 4) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pRVar1 + newSize;
  }
  pRVar3 = (Reader *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x30,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = pRVar3 + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pRVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pRVar1;
  local_48.ptr = pRVar3;
  if (__n != 0) {
    memcpy(pRVar3,pRVar1,__n);
  }
  local_48.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)((long)pRVar3 + __n);
  ArrayBuilder<capnp::json::Value::Field::Reader>::operator=(&this->builder,&local_48);
  pRVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pRVar1 = local_48.ptr;
  if (local_48.ptr != (Reader *)0x0) {
    local_48.ptr = (Reader *)0x0;
    local_48.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_48.endPtr = (Reader *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pRVar1,0x30,
               ((long)pRVar2 - (long)pRVar1 >> 4) * -0x5555555555555555,
               ((long)pRVar3 - (long)pRVar1 >> 4) * -0x5555555555555555,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }